

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.h
# Opt level: O1

void __thiscall CScheduler::stop(CScheduler *this)

{
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock0;
  unique_lock<std::mutex> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20._M_device = &(this->newTaskMutex).super_mutex;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  this->stopRequested = true;
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  std::condition_variable::notify_all();
  if ((this->m_service_thread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void stop() EXCLUSIVE_LOCKS_REQUIRED(!newTaskMutex)
    {
        WITH_LOCK(newTaskMutex, stopRequested = true);
        newTaskScheduled.notify_all();
        if (m_service_thread.joinable()) m_service_thread.join();
    }